

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

fsg_model_t * jsgf_read_string(char *string,logmath_t *lmath,float32 lw)

{
  jsgf_t *grammar;
  hash_iter_t *itor;
  fsg_model_t *pfVar1;
  char *fmt;
  long ln;
  jsgf_rule_t *rule;
  
  grammar = jsgf_parse_string(string,(jsgf_t *)0x0);
  if (grammar == (jsgf_t *)0x0) {
    fmt = "Error parsing input string\n";
    ln = 0x244;
  }
  else {
    itor = jsgf_rule_iter(grammar);
    rule = (jsgf_rule_t *)0x0;
    for (; itor != (hash_iter_t *)0x0; itor = hash_table_iter_next(itor)) {
      rule = (jsgf_rule_t *)itor->ent->val;
      if (rule->is_public != 0) {
        hash_table_iter_free(itor);
        goto LAB_0012d44c;
      }
    }
    if (rule != (jsgf_rule_t *)0x0) {
LAB_0012d44c:
      pfVar1 = jsgf_build_fsg(grammar,rule,lmath,lw);
      jsgf_grammar_free(grammar);
      return pfVar1;
    }
    jsgf_grammar_free(grammar);
    fmt = "No public rules found in input string\n";
    ln = 0x253;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/jsgf.c"
          ,ln,fmt);
  return (fsg_model_t *)0x0;
}

Assistant:

fsg_model_t *
jsgf_read_string(const char *string, logmath_t * lmath, float32 lw)
{
    fsg_model_t *fsg;
    jsgf_rule_t *rule;
    jsgf_t *jsgf;
    jsgf_rule_iter_t *itor;

    if ((jsgf = jsgf_parse_string(string, NULL)) == NULL) {
        E_ERROR("Error parsing input string\n");
        return NULL;
    }

    rule = NULL;
    for (itor = jsgf_rule_iter(jsgf); itor;
         itor = jsgf_rule_iter_next(itor)) {
        rule = jsgf_rule_iter_rule(itor);
        if (jsgf_rule_public(rule)) {
            jsgf_rule_iter_free(itor);
            break;
        }
    }
    if (rule == NULL) {
        jsgf_grammar_free(jsgf);
        E_ERROR("No public rules found in input string\n");
        return NULL;
    }
    fsg = jsgf_build_fsg(jsgf, rule, lmath, lw);
    jsgf_grammar_free(jsgf);
    return fsg;
}